

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * __thiscall
testing::GetDirFromEnv_abi_cxx11_
          (string *__return_storage_ptr__,testing *this,
          initializer_list<const_char_*> environment_variables,char *fallback,char separator)

{
  pointer pcVar1;
  char *__s;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long lVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar5 = environment_variables._M_array == (iterator)0x0;
  if (!bVar5) {
    lVar4 = 0;
    do {
      __s = getenv(*(char **)(this + lVar4));
      if ((__s != (char *)0x0) && (*__s != '\0')) {
        sVar2 = strlen(__s);
        if (__s[sVar2 - 1] == '/') {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          sVar2 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,__s,__s + sVar2);
        }
        else {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          sVar2 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar2);
          pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_replace_aux(&local_50,local_50._M_string_length,0,1,'/');
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar1 = (pbVar3->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pbVar3->_M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        if (!bVar5) {
          return __return_storage_ptr__;
        }
        break;
      }
      lVar4 = lVar4 + 8;
      bVar5 = (long)environment_variables._M_array << 3 == lVar4;
    } while (!bVar5);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)environment_variables._M_len,
             (allocator<char> *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetDirFromEnv(
    std::initializer_list<const char*> environment_variables,
    const char* fallback, char separator) {
  for (const char* variable_name : environment_variables) {
    const char* value = internal::posix::GetEnv(variable_name);
    if (value != nullptr && value[0] != '\0') {
      if (value[strlen(value) - 1] != separator) {
        return std::string(value).append(1, separator);
      }
      return value;
    }
  }
  return fallback;
}